

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int trico_read_uint32(void *a,uint32_t **attrib,trico_stream_type st)

{
  trico_stream_type tVar1;
  uint uVar2;
  uint32_t uVar3;
  ssize_t sVar4;
  char *pcVar5;
  uint8_t *b1;
  uint8_t *b2;
  uint8_t *b3;
  uint8_t *b4;
  uint8_t *decompressed_b4;
  uint8_t *decompressed_b3;
  uint8_t *decompressed_b2;
  uint32_t bytes_decompressed;
  uint8_t *decompressed_b1;
  void *compressed;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_of_attribs;
  trico_archive *arch;
  uint32_t **ppuStack_20;
  trico_stream_type st_local;
  uint32_t **attrib_local;
  void *a_local;
  
  _nr_of_compressed_bytes = (trico_archive *)a;
  arch._4_4_ = st;
  ppuStack_20 = attrib;
  attrib_local = (uint32_t **)a;
  tVar1 = trico_get_next_stream_type(a);
  if (tVar1 == arch._4_4_) {
    sVar4 = read((int)&compressed + 4,(void *)0x4,1);
    if ((int)sVar4 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      sVar4 = read((int)&compressed,(void *)0x4,1);
      if ((int)sVar4 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        pcVar5 = (char *)trico_malloc((ulong)(uint)compressed);
        sVar4 = read((int)pcVar5,(void *)0x1,(ulong)(uint)compressed);
        if ((int)sVar4 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          b1 = (uint8_t *)trico_malloc((ulong)compressed._4_4_);
          uVar2 = LZ4_decompress_safe(pcVar5,(char *)b1,(uint)compressed,compressed._4_4_);
          if (uVar2 != compressed._4_4_) {
            __assert_fail("bytes_decompressed == nr_of_attribs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                          ,0x5e6,
                          "int trico_read_uint32(void *, uint32_t **, enum trico_stream_type)");
          }
          sVar4 = read((int)&compressed,(void *)0x4,1);
          if ((int)sVar4 == 0) {
            a_local._4_4_ = 0;
          }
          else {
            pcVar5 = (char *)trico_realloc(pcVar5,(ulong)(uint)compressed);
            sVar4 = read((int)pcVar5,(void *)0x1,(ulong)(uint)compressed);
            if ((int)sVar4 == 0) {
              a_local._4_4_ = 0;
            }
            else {
              b2 = (uint8_t *)trico_malloc((ulong)compressed._4_4_);
              uVar2 = LZ4_decompress_safe(pcVar5,(char *)b2,(uint)compressed,compressed._4_4_);
              if (uVar2 != compressed._4_4_) {
                __assert_fail("bytes_decompressed == nr_of_attribs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                              ,0x5ef,
                              "int trico_read_uint32(void *, uint32_t **, enum trico_stream_type)");
              }
              sVar4 = read((int)&compressed,(void *)0x4,1);
              if ((int)sVar4 == 0) {
                a_local._4_4_ = 0;
              }
              else {
                pcVar5 = (char *)trico_realloc(pcVar5,(ulong)(uint)compressed);
                sVar4 = read((int)pcVar5,(void *)0x1,(ulong)(uint)compressed);
                if ((int)sVar4 == 0) {
                  a_local._4_4_ = 0;
                }
                else {
                  b3 = (uint8_t *)trico_malloc((ulong)compressed._4_4_);
                  uVar2 = LZ4_decompress_safe(pcVar5,(char *)b3,(uint)compressed,compressed._4_4_);
                  if (uVar2 != compressed._4_4_) {
                    __assert_fail("bytes_decompressed == nr_of_attribs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                  ,0x5f8,
                                  "int trico_read_uint32(void *, uint32_t **, enum trico_stream_type)"
                                 );
                  }
                  sVar4 = read((int)&compressed,(void *)0x4,1);
                  if ((int)sVar4 == 0) {
                    a_local._4_4_ = 0;
                  }
                  else {
                    pcVar5 = (char *)trico_realloc(pcVar5,(ulong)(uint)compressed);
                    sVar4 = read((int)pcVar5,(void *)0x1,(ulong)(uint)compressed);
                    if ((int)sVar4 == 0) {
                      a_local._4_4_ = 0;
                    }
                    else {
                      b4 = (uint8_t *)trico_malloc((ulong)compressed._4_4_);
                      uVar3 = LZ4_decompress_safe(pcVar5,(char *)b4,(uint)compressed,
                                                  compressed._4_4_);
                      if (uVar3 != compressed._4_4_) {
                        __assert_fail("bytes_decompressed == nr_of_attribs",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                      ,0x601,
                                      "int trico_read_uint32(void *, uint32_t **, enum trico_stream_type)"
                                     );
                      }
                      if (ppuStack_20 != (uint32_t **)0x0) {
                        trico_transpose_uint32_soa_to_aos(ppuStack_20,b1,b2,b3,b4,compressed._4_4_);
                      }
                      trico_free(pcVar5);
                      trico_free(b1);
                      trico_free(b2);
                      trico_free(b3);
                      trico_free(b4);
                      read_next_stream_type(_nr_of_compressed_bytes);
                      a_local._4_4_ = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int trico_read_uint32(void* a, uint32_t** attrib, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != st)
    return 0;

  uint32_t nr_of_attribs;
  if (!read(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b1 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint32_t bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b1, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b2 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b2, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b3 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b3, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b4 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b4, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (attrib != NULL)
    trico_transpose_uint32_soa_to_aos(attrib, decompressed_b1, decompressed_b2, decompressed_b3, decompressed_b4, nr_of_attribs);

  trico_free(compressed);
  trico_free(decompressed_b1);
  trico_free(decompressed_b2);
  trico_free(decompressed_b3);
  trico_free(decompressed_b4);

  read_next_stream_type(arch);

  return 1;
  }